

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O3

int ucstricmp(qsizetype alen,char16_t *a,qsizetype blen,char *b)

{
  byte bVar1;
  char16_t cVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  qsizetype qVar6;
  long lVar7;
  uint uVar8;
  long lVar9;
  
  qVar6 = blen;
  if (alen < blen) {
    qVar6 = alen;
  }
  if (qVar6 < 1) {
    qVar6 = 0;
  }
  else {
    lVar7 = 0;
    do {
      cVar2 = a[lVar7];
      uVar5 = (uint)(ushort)cVar2;
      uVar4 = (uint)(int)(short)*(ushort *)
                                 (QUnicodeTables::uc_properties +
                                 (ulong)*(ushort *)
                                         (QUnicodeTables::uc_property_trie +
                                         (ulong)(((ushort)cVar2 & 0x1f) +
                                                (uint)*(ushort *)
                                                       (QUnicodeTables::uc_property_trie +
                                                       (ulong)((ushort)cVar2 >> 5) * 2)) * 2) * 0x14
                                 + 0xe) >> 1;
      if ((*(ushort *)
            (QUnicodeTables::uc_properties +
            (ulong)*(ushort *)
                    (QUnicodeTables::uc_property_trie +
                    (ulong)(((ushort)cVar2 & 0x1f) +
                           (uint)*(ushort *)
                                  (QUnicodeTables::uc_property_trie +
                                  (ulong)((ushort)cVar2 >> 5) * 2)) * 2) * 0x14 + 0xe) & 1) == 0) {
        uVar5 = uVar4 + (ushort)cVar2;
      }
      else {
        lVar9 = (long)(short)uVar4;
        if (*(short *)(QUnicodeTables::specialCaseMap + lVar9 * 2) == 1) {
          uVar5 = (uint)*(ushort *)(QUnicodeTables::specialCaseMap + lVar9 * 2 + 2);
        }
      }
      bVar1 = b[lVar7];
      uVar4 = (uint)bVar1;
      uVar8 = (uint)(int)(short)*(ushort *)
                                 (QUnicodeTables::uc_properties +
                                 (ulong)*(ushort *)
                                         (QUnicodeTables::uc_property_trie +
                                         (ulong)((bVar1 & 0x1f) +
                                                (uint)*(ushort *)
                                                       (QUnicodeTables::uc_property_trie +
                                                       (ulong)(bVar1 >> 5) * 2)) * 2) * 0x14 + 0xe)
              >> 1;
      if ((*(ushort *)
            (QUnicodeTables::uc_properties +
            (ulong)*(ushort *)
                    (QUnicodeTables::uc_property_trie +
                    (ulong)((bVar1 & 0x1f) +
                           (uint)*(ushort *)
                                  (QUnicodeTables::uc_property_trie + (ulong)(bVar1 >> 5) * 2)) * 2)
            * 0x14 + 0xe) & 1) == 0) {
        uVar4 = bVar1 + uVar8;
      }
      else {
        lVar9 = (long)(short)uVar8;
        if (*(short *)(QUnicodeTables::specialCaseMap + lVar9 * 2) == 1) {
          uVar4 = (uint)*(ushort *)(QUnicodeTables::specialCaseMap + lVar9 * 2 + 2);
        }
      }
      iVar3 = (uVar5 & 0xffff) - (uVar4 & 0xffff);
      if (iVar3 != 0) {
        return iVar3;
      }
      lVar7 = lVar7 + 1;
    } while (qVar6 != lVar7);
  }
  iVar3 = 1;
  if (qVar6 == alen) {
    iVar3 = -(uint)(alen != blen);
  }
  return iVar3;
}

Assistant:

Q_NEVER_INLINE static int ucstricmp(qsizetype alen, const char16_t *a, qsizetype blen, const char *b)
{
    qsizetype l = qMin(alen, blen);
    qsizetype i;
    for (i = 0; i < l; ++i) {
        int diff = foldCase(a[i]) - foldCase(char16_t{uchar(b[i])});
        if ((diff))
            return diff;
    }
    if (i == alen) {
        if (i == blen)
            return 0;
        return -1;
    }
    return 1;
}